

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     doStartIfFalse(CoalesceLocals *self,Expression **currp)

{
  iterator __position;
  BasicBlock *__from;
  pointer ppBVar1;
  BasicBlock *__to;
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this;
  
  __position._M_current =
       *(pointer *)
        ((long)&(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .ifLastBlockStack.
                super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
               ).
               super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
               .
               super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
               .ifLastBlockStack.
               super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>>
    ::
    _M_realloc_insert<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*const&>
              ((vector<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>>
                *)&(self->
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                   .
                   super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                   .ifLastBlockStack,__position,
               &(self->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .currBasicBlock);
    ppBVar1 = *(pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                       .
                       super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                       .ifLastBlockStack.
                       super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
  }
  else {
    *__position._M_current =
         (self->
         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
         ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
         super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
         .currBasicBlock;
    ppBVar1 = *(pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                       .
                       super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                       .ifLastBlockStack.
                       super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8) + 1;
    *(pointer *)
     ((long)&(self->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
             .ifLastBlockStack.
             super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data + 8) = ppBVar1;
  }
  this = &(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>;
  __from = ppBVar1[-2];
  __to = startBasicBlock(&this->
                          super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                        );
  link(&this->
        super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
       ,(char *)__from,(char *)__to);
  return;
}

Assistant:

static void doStartIfFalse(SubType* self, Expression** currp) {
    self->ifLastBlockStack.push_back(
      self->currBasicBlock); // the ifTrue fallthrough
    self->link(self->ifLastBlockStack[self->ifLastBlockStack.size() - 2],
               self->startBasicBlock()); // before if -> ifFalse
  }